

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O0

GLuint __thiscall
deqp::gles3::Functional::anon_unknown_0::BufferVAOAttacher::getAttachment
          (BufferVAOAttacher *this,GLuint varr)

{
  GLenum err;
  Functions *pFVar1;
  GLuint local_18;
  GLuint local_14;
  GLint name;
  GLuint varr_local;
  BufferVAOAttacher *this_local;
  
  local_18 = 0;
  local_14 = varr;
  _name = this;
  pFVar1 = deqp::gls::LifetimeTests::details::ContextWrapper::gl
                     (&(this->super_Attacher).super_ContextWrapper);
  (*pFVar1->bindVertexArray)(local_14);
  pFVar1 = deqp::gls::LifetimeTests::details::ContextWrapper::gl
                     (&(this->super_Attacher).super_ContextWrapper);
  (*pFVar1->getVertexAttribiv)(0,0x889f,(GLint *)&local_18);
  pFVar1 = deqp::gls::LifetimeTests::details::ContextWrapper::gl
                     (&(this->super_Attacher).super_ContextWrapper);
  (*pFVar1->bindVertexArray)(0);
  pFVar1 = deqp::gls::LifetimeTests::details::ContextWrapper::gl
                     (&(this->super_Attacher).super_ContextWrapper);
  err = (*pFVar1->getError)();
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                  ,0x11c);
  return local_18;
}

Assistant:

GLuint BufferVAOAttacher::getAttachment (GLuint varr)
{
	GLint name = 0;
	gl().bindVertexArray(varr);
	gl().getVertexAttribiv(0, GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING, &name);
	gl().bindVertexArray(0);
	GLU_CHECK_ERROR(gl().getError());
	return GLuint(name);
}